

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O3

int Abc_GraphBuildState(Vec_Int_t *vState,int e,int x,Vec_Int_t *vEdges,Vec_Int_t *vLife,
                       Vec_Wec_t *vFronts,int *pFront,Vec_Int_t *vStateNew,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  uint *puVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint local_5c;
  int *local_58;
  ulong local_50;
  int local_44;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  if (-1 < e) {
    uVar16 = (ulong)(uint)e;
    if ((e < vFronts->nSize) && (e + 1U < (uint)vFronts->nSize)) {
      if (vEdges->nSize <= e * 2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      local_58 = vEdges->pArray;
      local_38 = (ulong)(uint)(e * 2);
      if (local_58[local_38 + 1] <= local_58[local_38]) {
        __assert_fail("pNodes[0] < pNodes[1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPath.c"
                      ,0x17b,
                      "int Abc_GraphBuildState(Vec_Int_t *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, int *, Vec_Int_t *, int)"
                     );
      }
      local_40 = e + 1U;
      pVVar3 = vFronts->pArray;
      local_44 = vLife->nSize;
      if (fVerbose != 0) {
        printf("Edge = %d. Arc = %d.\nCurrent state: ",(ulong)(uint)e,(ulong)(uint)x);
      }
      local_50 = uVar16;
      if (0 < pVVar3[uVar16].nSize) {
        lVar17 = 0;
        do {
          if (vState->nSize <= lVar17) goto LAB_00496d7a;
          uVar1 = vState->pArray[lVar17];
          pFront[pVVar3[uVar16].pArray[lVar17]] = uVar1;
          if (fVerbose != 0) {
            printf("%d(%d) ",(ulong)(uVar1 & 0xffff),(ulong)(uint)((int)uVar1 >> 0x10));
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < pVVar3[uVar16].nSize);
      }
      uVar1 = local_40;
      iVar13 = local_44;
      if (fVerbose != 0) {
        putchar(10);
      }
      piVar6 = local_58 + local_38;
      lVar17 = 0;
      bVar9 = true;
      do {
        bVar7 = bVar9;
        iVar10 = piVar6[lVar17];
        if ((long)iVar10 < 0) goto LAB_00496d7a;
        uVar2 = iVar10 * 2;
        uVar8 = vLife->nSize;
        if (uVar8 == uVar2 || SBORROW4(uVar8,uVar2) != (int)(uVar8 + iVar10 * -2) < 0)
        goto LAB_00496d7a;
        piVar4 = vLife->pArray;
        if (piVar4[uVar2] == (int)local_50) {
          pFront[iVar10] = iVar10;
        }
        lVar17 = 1;
        bVar9 = false;
      } while (bVar7);
      iVar10 = *piVar6;
      iVar12 = piVar6[1];
      if (x != 0) {
        if ((short)pFront[iVar12] == (short)pFront[iVar10]) {
          return -1;
        }
        lVar17 = 0;
        bVar9 = true;
        do {
          bVar7 = bVar9;
          iVar10 = piVar6[lVar17];
          iVar12 = pFront[iVar10] >> 0x10;
          if (iVar10 == iVar13 / 2 + -1 || iVar10 == 0) {
            if (0 < iVar12) {
              return -1;
            }
          }
          else if (1 < iVar12) {
            return -1;
          }
          pFront[iVar10] = pFront[iVar10] + 0x10000;
          lVar17 = 1;
          bVar9 = false;
        } while (bVar7);
        iVar10 = *piVar6;
        iVar12 = piVar6[1];
      }
      iVar13 = iVar13 / 2 + -1;
      puVar11 = &local_3c;
      local_3c = (uint)*(ushort *)(pFront + iVar10);
      local_5c = (uint)*(ushort *)(pFront + iVar12);
      lVar17 = 0;
      local_58 = (int *)CONCAT44(local_58._4_4_,iVar13);
      bVar9 = true;
      while( true ) {
        iVar10 = piVar6[lVar17];
        if (((long)iVar10 < 0) || (uVar8 = iVar10 * 2 + 1, vLife->nSize <= (int)uVar8)) break;
        if (piVar4[uVar8] == (int)local_50) {
          iVar12 = pFront[iVar10] >> 0x10;
          if ((iVar10 == 0) || (iVar10 == iVar13)) {
            if (iVar12 != 1) {
              return -1;
            }
          }
          else if (0xffff < (uint)pFront[iVar10] && iVar12 != 2) {
            return -1;
          }
          iVar10 = pVVar3[uVar1].nSize;
          if (0 < iVar10) {
            piVar5 = pVVar3[uVar1].pArray;
            uVar8 = 0xffffffff;
            lVar15 = 0;
            do {
              uVar2 = piVar5[lVar15];
              if (uVar2 == piVar6[lVar17]) {
                __assert_fail("Node != pNodes[n]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPath.c"
                              ,0x1a0,
                              "int Abc_GraphBuildState(Vec_Int_t *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, int *, Vec_Int_t *, int)"
                             );
              }
              if ((pFront[(int)uVar2] & 0xffffU) == *puVar11) {
                if (uVar8 == 0xffffffff) {
                  uVar8 = uVar2;
                }
                pFront[(int)uVar2] = pFront[(int)uVar2] & 0xffff0000U | uVar8;
                iVar10 = pVVar3[uVar1].nSize;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < iVar10);
            iVar13 = (int)local_58;
            if (uVar8 != 0xffffffff) {
              *puVar11 = uVar8;
            }
          }
        }
        lVar17 = 1;
        puVar11 = &local_5c;
        bVar7 = !bVar9;
        bVar9 = false;
        if (bVar7) {
          if ((x != 0) && (iVar13 = pVVar3[uVar1].nSize, 0 < iVar13)) {
            piVar6 = pVVar3[uVar1].pArray;
            uVar8 = 0xffffffff;
            lVar17 = 0;
            do {
              uVar2 = piVar6[lVar17];
              uVar14 = pFront[(int)uVar2] & 0xffff;
              if ((uVar14 == local_3c) || (uVar14 == local_5c)) {
                if (uVar8 == 0xffffffff) {
                  uVar8 = uVar2;
                }
                pFront[(int)uVar2] = pFront[(int)uVar2] & 0xffff0000U | uVar8;
                iVar13 = pVVar3[uVar1].nSize;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < iVar13);
          }
          vStateNew->nSize = 0;
          if (fVerbose != 0) {
            printf("Next state: ");
          }
          if (0 < pVVar3[uVar1].nSize) {
            lVar17 = 0;
            do {
              iVar13 = pVVar3[uVar1].pArray[lVar17];
              Vec_IntPush(vStateNew,pFront[iVar13]);
              if (fVerbose != 0) {
                printf("%d(%d) ",(ulong)(pFront[iVar13] & 0xffff),
                       (ulong)(uint)(pFront[iVar13] >> 0x10));
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < pVVar3[uVar1].nSize);
          }
          if (fVerbose != 0) {
            puts("\n");
          }
          return 1;
        }
      }
LAB_00496d7a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Abc_GraphBuildState( Vec_Int_t * vState, int e, int x, Vec_Int_t * vEdges, Vec_Int_t * vLife, Vec_Wec_t * vFronts, int * pFront, Vec_Int_t * vStateNew, int fVerbose )
{
    Vec_Int_t * vFront = Vec_WecEntry( vFronts, e );
    Vec_Int_t * vFront2 = Vec_WecEntry( vFronts, e+1 );
    int * pNodes = Vec_IntEntryP(vEdges, 2*e);
    int nNodes = Vec_IntSize(vLife)/2;
    int i, n, Node, First, pEquivs[2];
    assert( pNodes[0] < pNodes[1] );
    if ( fVerbose ) printf( "Edge = %d. Arc = %d.\nCurrent state: ", e, x );
    Vec_IntForEachEntry( vFront, Node, i )
    {
        pFront[Node] = Vec_IntEntry(vState, i);
        if ( fVerbose ) printf( "%d(%d) ", pFront[Node] & 0xFFFF, pFront[Node] >> 16 );
    }
    if ( fVerbose ) printf( "\n" );
    for ( n = 0; n < 2; n++ )
        if ( Vec_IntEntry(vLife, 2*pNodes[n]) == e ) // first time
            pFront[pNodes[n]] = pNodes[n]; // degree = 0; comp = singleton
    if ( x )
    {
        if ( (pFront[pNodes[0]] & 0xFFFF) == (pFront[pNodes[1]] & 0xFFFF) ) // the same comp
            return -1; // const 0
        for ( n = 0; n < 2; n++ )
        {
            int Degree = pFront[pNodes[n]] >> 16;
            if ( (pNodes[n] == 0 || pNodes[n] == nNodes-1) ? Degree >= 1 : Degree >= 2 )
                return -1; // const 0
            pFront[pNodes[n]] += (1 << 16); // degree++
        }
    }
    // remember equivalence classes
    pEquivs[0] = pFront[pNodes[0]] & 0xFFFF;
    pEquivs[1] = pFront[pNodes[1]] & 0xFFFF;
    // remove some nodes from the frontier
    for ( n = 0; n < 2; n++ )
        if ( Vec_IntEntry(vLife, 2*pNodes[n]+1) == e ) // last time
        {
            int Degree = pFront[pNodes[n]] >> 16;
            if ( (pNodes[n] == 0 || pNodes[n] == nNodes-1) ? Degree != 1 : Degree != 0 && Degree != 2 )
                return -1; // const 0
            // if it is part of the comp, update
            First = -1;
            Vec_IntForEachEntry( vFront2, Node, i )
            {
                assert( Node != pNodes[n] );
                if ( (pFront[Node] & 0xFFFF) == pEquivs[n] )
                {
                    if ( First == -1 )
                        First = Node;
                    pFront[Node] = (pFront[Node] & 0xFFFF0000) | First;
                }
            }
            if ( First != -1 )
                pEquivs[n] = First;
        }
    if ( x )
    {
        // union comp
        int First = -1;
        Vec_IntForEachEntry( vFront2, Node, i )
            if ( (pFront[Node] & 0xFFFF) == pEquivs[0] || (pFront[Node] & 0xFFFF) == pEquivs[1] )
            {
                if ( First == -1 )
                    First = Node;
                pFront[Node] = (pFront[Node] & 0xFFFF0000) | First;
            }
    }
    // create next state
    Vec_IntClear( vStateNew );
    if ( fVerbose ) printf( "Next state: " );
    Vec_IntForEachEntry( vFront2, Node, i )
    {
        Vec_IntPush( vStateNew, pFront[Node] );
        if ( fVerbose ) printf( "%d(%d) ", pFront[Node] & 0xFFFF, pFront[Node] >> 16 );
    }
    if ( fVerbose ) printf( "\n\n" );
    return 1;
}